

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_lt_mpi_ct(mbedtls_mpi *X,mbedtls_mpi *Y,uint *ret)

{
  uint uVar1;
  mbedtls_mpi_uint mVar2;
  mbedtls_mpi_uint mVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  uint uVar11;
  
  sVar10 = X->n;
  iVar5 = -4;
  if (sVar10 == Y->n) {
    uVar1 = X->s;
    uVar6 = uVar1 ^ Y->s;
    uVar7 = uVar6 >> 1;
    *ret = (uVar1 & uVar6) >> 1 & 1;
    iVar5 = 0;
    if (sVar10 != 0) {
      uVar6 = *ret;
      do {
        mVar2 = Y->p[sVar10 - 1];
        mVar3 = X->p[sVar10 - 1];
        sVar10 = sVar10 - 1;
        uVar8 = (uint)(mVar3 >> 0x20);
        uVar4 = (uint)(mVar2 >> 0x20);
        uVar9 = uVar8 ^ uVar4;
        uVar11 = (uVar9 & uVar8 | (uint)(mVar2 - mVar3 >> 0x20) & ~uVar9) >> 0x1f;
        uVar8 = uVar7 | uVar11;
        uVar9 = (uVar9 & uVar4 | (uint)(mVar3 - mVar2 >> 0x20) & ~uVar9) >> 0x1f;
        uVar6 = ~(uVar1 >> 1) & uVar9 & 1 - uVar8 | 1 - uVar7 & uVar1 >> 1 & uVar11 | uVar6;
        uVar7 = uVar8 | uVar9;
      } while (sVar10 != 0);
      *ret = uVar6;
    }
  }
  return iVar5;
}

Assistant:

int mbedtls_mpi_lt_mpi_ct( const mbedtls_mpi *X, const mbedtls_mpi *Y,
        unsigned *ret )
{
    size_t i;
    /* The value of any of these variables is either 0 or 1 at all times. */
    unsigned cond, done, X_is_negative, Y_is_negative;

    MPI_VALIDATE_RET( X != NULL );
    MPI_VALIDATE_RET( Y != NULL );
    MPI_VALIDATE_RET( ret != NULL );

    if( X->n != Y->n )
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;

    /*
     * Set sign_N to 1 if N >= 0, 0 if N < 0.
     * We know that N->s == 1 if N >= 0 and N->s == -1 if N < 0.
     */
    X_is_negative = ( X->s & 2 ) >> 1;
    Y_is_negative = ( Y->s & 2 ) >> 1;

    /*
     * If the signs are different, then the positive operand is the bigger.
     * That is if X is negative (X_is_negative == 1), then X < Y is true and it
     * is false if X is positive (X_is_negative == 0).
     */
    cond = ( X_is_negative ^ Y_is_negative );
    *ret = cond & X_is_negative;

    /*
     * This is a constant-time function. We might have the result, but we still
     * need to go through the loop. Record if we have the result already.
     */
    done = cond;

    for( i = X->n; i > 0; i-- )
    {
        /*
         * If Y->p[i - 1] < X->p[i - 1] then X < Y is true if and only if both
         * X and Y are negative.
         *
         * Again even if we can make a decision, we just mark the result and
         * the fact that we are done and continue looping.
         */
        cond = ct_lt_mpi_uint( Y->p[i - 1], X->p[i - 1] );
        *ret |= cond & ( 1 - done ) & X_is_negative;
        done |= cond;

        /*
         * If X->p[i - 1] < Y->p[i - 1] then X < Y is true if and only if both
         * X and Y are positive.
         *
         * Again even if we can make a decision, we just mark the result and
         * the fact that we are done and continue looping.
         */
        cond = ct_lt_mpi_uint( X->p[i - 1], Y->p[i - 1] );
        *ret |= cond & ( 1 - done ) & ( 1 - X_is_negative );
        done |= cond;
    }

    return( 0 );
}